

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_msh(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_CELL ref_cell;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  REF_STATUS RVar8;
  REF_CELL_TYPE RVar9;
  FILE *__stream;
  void *__s;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  uint local_a8 [4];
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  long local_38;
  
  pRVar1 = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar13 = "unable to open file";
    uVar14 = 0x87f;
  }
  else {
    fprintf(__stream,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x4010666666666666,0);
    iVar17 = pRVar1->max;
    lVar20 = (long)iVar17;
    if (lVar20 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x884,"ref_export_msh","malloc o2n of REF_INT negative");
      return 1;
    }
    __s = malloc(lVar20 * 4);
    if (__s != (void *)0x0) {
      if (iVar17 == 0) {
        fprintf(__stream,"$Nodes\n1 %d 1 %d\n%d 1 0 %d\n",0,0,3);
      }
      else {
        memset(__s,0xff,lVar20 * 4);
        pRVar2 = pRVar1->global;
        lVar10 = 0;
        uVar18 = 0;
        do {
          if (-1 < pRVar2[lVar10]) {
            *(int *)((long)__s + (long)(int)uVar18 * 4) = (int)lVar10;
            uVar18 = uVar18 + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar20 != lVar10);
        fprintf(__stream,"$Nodes\n1 %d 1 %d\n%d 1 0 %d\n",(ulong)uVar18,(ulong)uVar18,3);
        if (0 < (int)uVar18) {
          uVar11 = 1;
          do {
            fprintf(__stream,"%d\n",(ulong)uVar11);
            bVar21 = uVar11 != uVar18;
            uVar11 = uVar11 + 1;
          } while (bVar21);
          if (0 < (int)uVar18) {
            uVar16 = 0;
            do {
              pRVar3 = pRVar1->real;
              lVar20 = (long)*(int *)((long)__s + uVar16 * 4);
              fprintf(__stream,"%.16E %.16E %.16E\n",pRVar3[lVar20 * 0xf],pRVar3[lVar20 * 0xf + 1],
                      pRVar3[lVar20 * 0xf + 2]);
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
        }
      }
      fwrite("$EndNodes\n",10,1,__stream);
      lVar20 = 0;
      uVar12 = 0;
      uVar16 = 0;
      iVar17 = 0;
      do {
        iVar19 = ref_grid->cell[lVar20]->n;
        iVar15 = iVar19;
        if (iVar19 < iVar17) {
          iVar15 = iVar17;
        }
        bVar21 = 0 < iVar19;
        if (iVar19 < 1) {
          iVar19 = 0;
          iVar15 = iVar17;
        }
        iVar17 = iVar15;
        uVar16 = (ulong)(uint)((int)uVar16 + iVar19);
        uVar12 = (ulong)((int)uVar12 + (uint)bVar21);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      fprintf(__stream,"$Elements\n%d %d %d %d\n",uVar12,uVar16,1);
      lVar20 = 0;
      uVar18 = 0;
      do {
        ref_cell = ref_grid->cell[lVar20];
        if (0 < ref_cell->n) {
          switch(ref_cell->type) {
          case REF_CELL_EDG:
            uVar14 = 1;
            break;
          case REF_CELL_ED2:
            uVar14 = 8;
            break;
          case REF_CELL_ED3:
            uVar14 = 0x1a;
            break;
          case REF_CELL_TRI:
            uVar14 = 2;
            break;
          case REF_CELL_TR2:
            uVar14 = 9;
            break;
          case REF_CELL_TR3:
            uVar14 = 0x15;
            break;
          case REF_CELL_QUA:
            uVar14 = 3;
            break;
          case REF_CELL_QU2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            return 6;
          case REF_CELL_TET:
            uVar14 = 4;
            break;
          case REF_CELL_PYR:
            uVar14 = 7;
            break;
          case REF_CELL_PRI:
            uVar14 = 6;
            break;
          case REF_CELL_HEX:
            uVar14 = 5;
            break;
          case REF_CELL_TE2:
            uVar14 = 0xb;
            break;
          default:
            uVar14 = 0xffffffff;
          }
          uVar18 = uVar18 + 1;
          fprintf(__stream,"%d %d %d %d\n",(ulong)uVar18,1,uVar14);
          if (0 < ref_cell->max) {
            iVar17 = 0;
            iVar19 = 0;
            local_38 = lVar20;
            do {
              RVar8 = ref_cell_nodes(ref_cell,iVar19,(REF_INT *)local_a8);
              uVar5 = local_a8[2];
              uVar4 = local_a8[1];
              uVar11 = local_a8[0];
              if (RVar8 == 0) {
                RVar9 = ref_cell->type;
                if (RVar9 == REF_CELL_PYR) {
                  local_a8[1] = local_a8[3];
                  local_a8[2] = uStack_98;
                  local_a8[3] = uVar4;
                  uStack_98 = uVar5;
                  RVar9 = ref_cell->type;
                }
                uVar7 = uStack_98;
                uVar5 = local_a8[3];
                uVar4 = local_a8[1];
                if (RVar9 == REF_CELL_TE2) {
                  RVar9 = ref_cell->type;
                }
                if (RVar9 == REF_CELL_TRI) {
                  local_a8[0] = local_a8[2];
                  local_a8[2] = uVar11;
                  RVar9 = ref_cell->type;
                }
                uVar6 = local_a8[2];
                uVar11 = local_a8[0];
                if (RVar9 == REF_CELL_TR2) {
                  local_a8[0] = local_a8[2];
                  local_a8[2] = uVar11;
                  local_a8[3] = uStack_98;
                  uStack_98 = uVar5;
                  RVar9 = ref_cell->type;
                  if (RVar9 == REF_CELL_TR2) {
                    local_a8[0] = uVar11;
                    local_a8[2] = uVar6;
                    local_a8[3] = uStack_90;
                    uStack_98 = uStack_94;
                    uStack_94 = uVar7;
                    uStack_90 = uVar5;
                    RVar9 = ref_cell->type;
                  }
                }
                uVar11 = local_a8[0];
                if (RVar9 == REF_CELL_QUA) {
                  local_a8[0] = local_a8[1];
                  local_a8[1] = local_a8[2];
                  local_a8[2] = uVar4;
                  local_a8[3] = uVar11;
                }
                if (ref_cell->last_node_is_an_id == 0) {
                  uVar11 = iVar17 + 1;
                }
                else {
                  uVar11 = local_a8[ref_cell->node_per];
                }
                fprintf(__stream,"%d",(ulong)uVar11);
                if (0 < ref_cell->node_per) {
                  lVar20 = 0;
                  do {
                    fprintf(__stream," %d",(ulong)(local_a8[lVar20] + 1));
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < ref_cell->node_per);
                }
                fputc(10,__stream);
                iVar17 = iVar17 + 1;
              }
              iVar19 = iVar19 + 1;
              lVar20 = local_38;
            } while (iVar19 < ref_cell->max);
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      fwrite("$EndElements\n",0xd,1,__stream);
      free(__s);
      fclose(__stream);
      return 0;
    }
    pcVar13 = "malloc n2o of REF_INT NULL";
    uVar14 = 0x885;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar14,
         "ref_export_msh",pcVar13);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_msh(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT dim = 3;
  REF_INT *o2n, *n2o;
  REF_INT group, nbloc;
  REF_INT ncell, maxncell;
  REF_INT type;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_node;

  double version = 4.1;
  int filetype =
      0; /* file-type(ASCII int; 0 for ASCII mode, 1 for binary mode) */
  int datasize = 8; /* data-size(ASCII int; sizeof(size_t)) */

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n", version, filetype,
          datasize);

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }
  fprintf(f, "$Nodes\n1 %d 1 %d\n%d 1 0 %d\n", nnode, nnode, dim, nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%d\n", node + 1);
  }
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "$EndNodes\n");

  nbloc = 0;
  ncell = 0;
  maxncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      nbloc++;
      ncell += ref_cell_n(ref_cell);
      maxncell = MAX(maxncell, ref_cell_n(ref_cell));
    }
  }

  fprintf(f, "$Elements\n%d %d %d %d\n", nbloc, ncell, 1, maxncell);
  nbloc = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      nbloc++;
      type = REF_EMPTY;
      switch (ref_cell_type(ref_cell)) {
        case REF_CELL_EDG:
          type = 1;
          break;
        case REF_CELL_ED2:
          type = 8;
          break;
        case REF_CELL_ED3:
          type = 26;
          break;
        case REF_CELL_TRI:
          type = 2;
          break;
        case REF_CELL_TR2:
          type = 9;
          break;
        case REF_CELL_TR3:
          type = 21;
          break;
        case REF_CELL_QUA:
          type = 3;
          break;
        case REF_CELL_TET:
          type = 4;
          break;
        case REF_CELL_TE2:
          type = 11;
          break;
        case REF_CELL_PYR:
          type = 7;
          break;
        case REF_CELL_PRI:
          type = 6;
          break;
        case REF_CELL_HEX:
          type = 5;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return REF_IMPLEMENT;
      }
      fprintf(f, "%d %d %d %d\n", nbloc, 1, type, ref_cell_n(ref_cell));
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
          REF_INT n0, n1, n2, n3, n4;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
          REF_INT n9;
          n9 = nodes[9];
          nodes[9] = nodes[8];
          nodes[8] = n9;
        }
        if (REF_CELL_TRI == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n4;
          nodes[4] = n3;
          nodes[5] = n5;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5, n6, n7, n8, n9;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          n6 = nodes[6];
          n7 = nodes[7];
          n8 = nodes[8];
          n9 = nodes[9];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n6;
          nodes[4] = n5;
          nodes[5] = n3;
          nodes[6] = n4;
          nodes[7] = n8;
          nodes[8] = n7;
          nodes[9] = n9;
        }
        if (REF_CELL_QUA == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          nodes[0] = n3;
          nodes[1] = n2;
          nodes[2] = n1;
          nodes[3] = n0;
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          fprintf(f, "%d", nodes[ref_cell_id_index(ref_cell)]);
        } else {
          fprintf(f, "%d", ncell + 1);
        }
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(f, " %d", nodes[cell_node] + 1);
        }
        fprintf(f, "\n");
        ncell++;
      }
    }
  }
  fprintf(f, "$EndElements\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}